

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5ChunkIterate(Fts5Index *p,Fts5SegIter *pSeg,void *pCtx,
                     _func_void_Fts5Index_ptr_void_ptr_u8_ptr_int *xChunk)

{
  uint uVar1;
  Fts5Data *p_00;
  u8 *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  bool bVar8;
  
  iVar5 = pSeg->pLeaf->szLeaf - pSeg->iLeafOffset;
  puVar2 = pSeg->pLeaf->p + pSeg->iLeafOffset;
  iVar3 = pSeg->nPos;
  if (iVar3 < iVar5) {
    iVar5 = iVar3;
  }
  uVar1 = pSeg->iLeafPgno;
  lVar6 = (long)(int)uVar1;
  p_00 = (Fts5Data *)0x0;
  iVar7 = uVar1 + 1;
  if ((pSeg->flags & 2) != 0) {
    iVar7 = 0;
  }
  iVar7 = ~uVar1 + iVar7;
  while( true ) {
    lVar6 = lVar6 + 1;
    (*xChunk)(p,pCtx,puVar2,iVar5);
    sqlite3_free(p_00);
    iVar4 = iVar3 - iVar5;
    if (iVar4 == 0 || iVar3 < iVar5) {
      return;
    }
    p_00 = fts5LeafRead(p,((ulong)(uint)pSeg->pSeg->iSegid << 0x25) + lVar6);
    if (p_00 == (Fts5Data *)0x0) break;
    puVar2 = p_00->p;
    iVar5 = p_00->szLeaf + -4;
    if (iVar4 < iVar5) {
      iVar5 = iVar4;
    }
    bVar8 = iVar7 == 0;
    iVar7 = iVar7 + -1;
    if (bVar8) {
      pSeg->pNextLeaf = p_00;
      p_00 = (Fts5Data *)0x0;
    }
    puVar2 = puVar2 + 4;
    iVar3 = iVar4;
  }
  return;
}

Assistant:

static void fts5ChunkIterate(
  Fts5Index *p,                   /* Index object */
  Fts5SegIter *pSeg,              /* Poslist of this iterator */
  void *pCtx,                     /* Context pointer for xChunk callback */
  void (*xChunk)(Fts5Index*, void*, const u8*, int)
){
  int nRem = pSeg->nPos;          /* Number of bytes still to come */
  Fts5Data *pData = 0;
  u8 *pChunk = &pSeg->pLeaf->p[pSeg->iLeafOffset];
  int nChunk = MIN(nRem, pSeg->pLeaf->szLeaf - pSeg->iLeafOffset);
  int pgno = pSeg->iLeafPgno;
  int pgnoSave = 0;

  /* This function does notmwork with detail=none databases. */
  assert( p->pConfig->eDetail!=FTS5_DETAIL_NONE );

  if( (pSeg->flags & FTS5_SEGITER_REVERSE)==0 ){
    pgnoSave = pgno+1;
  }

  while( 1 ){
    xChunk(p, pCtx, pChunk, nChunk);
    nRem -= nChunk;
    fts5DataRelease(pData);
    if( nRem<=0 ){
      break;
    }else{
      pgno++;
      pData = fts5LeafRead(p, FTS5_SEGMENT_ROWID(pSeg->pSeg->iSegid, pgno));
      if( pData==0 ) break;
      pChunk = &pData->p[4];
      nChunk = MIN(nRem, pData->szLeaf - 4);
      if( pgno==pgnoSave ){
        assert( pSeg->pNextLeaf==0 );
        pSeg->pNextLeaf = pData;
        pData = 0;
      }
    }
  }
}